

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SceneCombiner.cpp
# Opt level: O1

void Assimp::SceneCombiner::BuildUniqueBoneList
               (list<Assimp::BoneWithHash,_std::allocator<Assimp::BoneWithHash>_> *asBones,
               const_iterator it,const_iterator end)

{
  size_t *psVar1;
  aiBone *paVar2;
  iterator iVar3;
  uint32_t uVar4;
  _List_node_base *p_Var5;
  aiMesh *paVar6;
  uint uVar7;
  ulong uVar8;
  pair<aiBone_*,_unsigned_int> local_48;
  aiMesh **local_38;
  
  if (it._M_current != end._M_current) {
    uVar7 = 0;
    local_38 = end._M_current;
    do {
      paVar6 = *it._M_current;
      if (paVar6->mNumBones != 0) {
        uVar8 = 0;
        do {
          paVar2 = paVar6->mBones[uVar8];
          uVar4 = SuperFastHash((paVar2->mName).data,(paVar2->mName).length,0);
          p_Var5 = (_List_node_base *)asBones;
          do {
            p_Var5 = (((_List_base<Assimp::BoneWithHash,_std::allocator<Assimp::BoneWithHash>_> *)
                      &p_Var5->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
            if (p_Var5 == (_List_node_base *)asBones) goto LAB_003a770c;
          } while (*(uint32_t *)&p_Var5[1]._M_next != uVar4);
          iVar3._M_current = (pair<aiBone_*,_unsigned_int> *)p_Var5[2]._M_prev;
          if ((_List_node_base *)iVar3._M_current == p_Var5[3]._M_next) {
            local_48.first = paVar2;
            local_48.second = uVar7;
            std::
            vector<std::pair<aiBone*,unsigned_int>,std::allocator<std::pair<aiBone*,unsigned_int>>>
            ::_M_realloc_insert<std::pair<aiBone*,unsigned_int>>
                      ((vector<std::pair<aiBone*,unsigned_int>,std::allocator<std::pair<aiBone*,unsigned_int>>>
                        *)(p_Var5 + 2),iVar3,&local_48);
          }
          else {
            (iVar3._M_current)->first = paVar2;
            *(ulong *)&(iVar3._M_current)->second = CONCAT44(local_48._12_4_,uVar7);
            p_Var5[2]._M_prev = p_Var5[2]._M_prev + 1;
            local_48.first = paVar2;
            local_48.second = uVar7;
          }
LAB_003a770c:
          if (p_Var5 == (_List_node_base *)asBones) {
            p_Var5 = (_List_node_base *)operator_new(0x38);
            p_Var5[1]._M_next = (_List_node_base *)0x0;
            p_Var5[1]._M_prev = (_List_node_base *)0x0;
            p_Var5[2]._M_next = (_List_node_base *)0x0;
            p_Var5[2]._M_prev = (_List_node_base *)0x0;
            p_Var5[3]._M_next = (_List_node_base *)0x0;
            std::__detail::_List_node_base::_M_hook(p_Var5);
            psVar1 = &(asBones->
                      super__List_base<Assimp::BoneWithHash,_std::allocator<Assimp::BoneWithHash>_>)
                      ._M_impl._M_node._M_size;
            *psVar1 = *psVar1 + 1;
            p_Var5 = (asBones->
                     super__List_base<Assimp::BoneWithHash,_std::allocator<Assimp::BoneWithHash>_>).
                     _M_impl._M_node.super__List_node_base._M_prev;
            *(uint32_t *)&p_Var5[1]._M_next = uVar4;
            p_Var5[1]._M_prev = (_List_node_base *)paVar2;
            iVar3._M_current = (pair<aiBone_*,_unsigned_int> *)p_Var5[2]._M_prev;
            if ((_List_node_base *)iVar3._M_current == p_Var5[3]._M_next) {
              local_48.first = paVar2;
              local_48.second = uVar7;
              std::
              vector<std::pair<aiBone*,unsigned_int>,std::allocator<std::pair<aiBone*,unsigned_int>>>
              ::_M_realloc_insert<std::pair<aiBone*,unsigned_int>>
                        ((vector<std::pair<aiBone*,unsigned_int>,std::allocator<std::pair<aiBone*,unsigned_int>>>
                          *)(p_Var5 + 2),iVar3,&local_48);
            }
            else {
              (iVar3._M_current)->first = paVar2;
              *(ulong *)&(iVar3._M_current)->second = CONCAT44(local_48._12_4_,uVar7);
              p_Var5[2]._M_prev = p_Var5[2]._M_prev + 1;
              local_48.first = paVar2;
              local_48.second = uVar7;
            }
          }
          uVar8 = uVar8 + 1;
          paVar6 = *it._M_current;
        } while (uVar8 < paVar6->mNumBones);
      }
      uVar7 = uVar7 + paVar6->mNumVertices;
      it._M_current = it._M_current + 1;
    } while (it._M_current != local_38);
  }
  return;
}

Assistant:

void SceneCombiner::BuildUniqueBoneList(std::list<BoneWithHash>& asBones,
    std::vector<aiMesh*>::const_iterator it,
    std::vector<aiMesh*>::const_iterator end)
{
    unsigned int iOffset = 0;
    for (; it != end;++it)  {
        for (unsigned int l = 0; l < (*it)->mNumBones;++l)  {
            aiBone* p = (*it)->mBones[l];
            uint32_t itml = SuperFastHash(p->mName.data,(unsigned int)p->mName.length);

            std::list<BoneWithHash>::iterator it2  = asBones.begin();
            std::list<BoneWithHash>::iterator end2 = asBones.end();

            for (;it2 != end2;++it2)    {
                if ((*it2).first == itml)   {
                    (*it2).pSrcBones.push_back(BoneSrcIndex(p,iOffset));
                    break;
                }
            }
            if (end2 == it2)    {
                // need to begin a new bone entry
                asBones.push_back(BoneWithHash());
                BoneWithHash& btz = asBones.back();

                // setup members
                btz.first = itml;
                btz.second = &p->mName;
                btz.pSrcBones.push_back(BoneSrcIndex(p,iOffset));
            }
        }
        iOffset += (*it)->mNumVertices;
    }
}